

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

FileDescriptor * __thiscall
google::protobuf::DescriptorBuilder::BuildFileImpl
          (DescriptorBuilder *this,FileDescriptorProto *proto)

{
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  RepeatedField<int> *this_01;
  RepeatedField<int> *this_02;
  _Rb_tree_header *p_Var1;
  Tables *pTVar2;
  Message *descriptor;
  MessageLite *this_03;
  long lVar3;
  undefined8 uVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  SourceCodeInfo *this_04;
  FileDescriptorTables *pFVar8;
  string *psVar9;
  void *pvVar10;
  GoogleOnceDynamic *pGVar11;
  int *piVar12;
  Type *pTVar13;
  const_iterator cVar14;
  const_iterator cVar15;
  _Base_ptr p_Var16;
  Type *pTVar17;
  Type *proto_00;
  Type *proto_01;
  Type *proto_02;
  undefined4 extraout_var;
  FieldDescriptor *pFVar18;
  LogMessage *pLVar19;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  DescriptorPool *pDVar20;
  long *plVar21;
  _Base_ptr p_Var22;
  _Rb_tree_header *p_Var23;
  size_type *psVar24;
  void *extraout_RDX;
  FileDescriptor *extraout_RDX_00;
  FileDescriptor *extraout_RDX_01;
  FileDescriptor *extraout_RDX_02;
  FileDescriptor *extraout_RDX_03;
  FileDescriptor *result;
  pointer pOVar25;
  int iVar26;
  SourceCodeInfo *from;
  FileOptions *orig_options;
  long lVar27;
  int i;
  long lVar28;
  pointer pOVar29;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar30;
  pointer pOVar31;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar32;
  pair<std::_Rb_tree_iterator<const_google::protobuf::FileDescriptor_*>,_std::_Rb_tree_iterator<const_google::protobuf::FileDescriptor_*>_>
  pVar33;
  string buf;
  FileDescriptor *dependency;
  set<int,_std::less<int>,_std::allocator<int>_> weak_deps;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  seen_dependencies;
  FileDescriptor *local_228;
  string local_218;
  pointer local_1f8;
  string local_1f0;
  undefined1 local_1d0 [16];
  undefined1 auStack_1c0 [48];
  size_type *local_190 [2];
  size_type local_180 [2];
  LogMessage local_170;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_138;
  undefined1 local_108 [48];
  LogMessage local_d8;
  LogMessage local_a0;
  LogMessage local_68;
  
  DescriptorPool::Tables::AddCheckpoint(this->tables_);
  local_228 = (FileDescriptor *)DescriptorPool::Tables::AllocateBytes(this->tables_,0xc0);
  this->file_ = local_228;
  local_228[0x90] = (FileDescriptor)0x0;
  local_228[0xb8] = (FileDescriptor)0x0;
  if (((proto->_has_bits_).has_bits_[0] & 0x10) == 0) {
    this_04 = SourceCodeInfo::default_instance();
  }
  else {
    this_04 = DescriptorPool::Tables::AllocateMessage<google::protobuf::SourceCodeInfo>
                        (this->tables_,(SourceCodeInfo *)0x0);
    from = proto->source_code_info_;
    if (from == (SourceCodeInfo *)0x0) {
      from = (SourceCodeInfo *)&_SourceCodeInfo_default_instance_;
    }
    SourceCodeInfo::CopyFrom(this_04,from);
  }
  *(SourceCodeInfo **)(local_228 + 0xb0) = this_04;
  pFVar8 = DescriptorPool::Tables::AllocateFileTables(this->tables_);
  this->file_tables_ = pFVar8;
  *(FileDescriptorTables **)(this->file_ + 0xa8) = pFVar8;
  if (((proto->_has_bits_).has_bits_[0] & 1) == 0) {
    local_1d0._8_8_ = (OptionsToInterpret *)0x0;
    auStack_1c0._0_8_ = auStack_1c0._0_8_ & 0xffffffffffffff00;
    local_1d0._0_8_ = (DescriptorBuilder *)auStack_1c0;
    AddError(this,(string *)local_1d0,&proto->super_Message,OTHER,
             "Missing field: FileDescriptorProto.name.");
    if ((DescriptorBuilder *)local_1d0._0_8_ != (DescriptorBuilder *)auStack_1c0) {
      operator_delete((void *)local_1d0._0_8_,(ulong)(auStack_1c0._0_8_ + 1));
    }
  }
  psVar9 = (proto->syntax_).ptr_;
  if ((psVar9->_M_string_length == 0) ||
     (iVar6 = std::__cxx11::string::compare((char *)psVar9), iVar6 == 0)) {
    *(undefined4 *)(this->file_ + 0x8c) = 2;
  }
  else {
    iVar6 = std::__cxx11::string::compare((char *)(proto->syntax_).ptr_);
    if (iVar6 == 0) {
      *(undefined4 *)(this->file_ + 0x8c) = 3;
    }
    else {
      *(undefined4 *)(this->file_ + 0x8c) = 0;
      psVar9 = (proto->name_).ptr_;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0,
                     "Unrecognized syntax: ",(proto->syntax_).ptr_);
      AddError(this,psVar9,&proto->super_Message,OTHER,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0);
      if ((DescriptorBuilder *)local_1d0._0_8_ != (DescriptorBuilder *)auStack_1c0) {
        operator_delete((void *)local_1d0._0_8_,(ulong)(auStack_1c0._0_8_ + 1));
      }
    }
  }
  psVar9 = DescriptorPool::Tables::AllocateString(this->tables_,(proto->name_).ptr_);
  *(string **)local_228 = psVar9;
  if (((proto->_has_bits_).has_bits_[0] & 2) == 0) {
    local_1d0._8_8_ = (OptionsToInterpret *)0x0;
    auStack_1c0._0_8_ = auStack_1c0._0_8_ & 0xffffffffffffff00;
    local_1d0._0_8_ = (DescriptorBuilder *)auStack_1c0;
    psVar9 = DescriptorPool::Tables::AllocateString(this->tables_,(string *)local_1d0);
    *(string **)(local_228 + 8) = psVar9;
    if ((DescriptorBuilder *)local_1d0._0_8_ != (DescriptorBuilder *)auStack_1c0) {
      operator_delete((void *)local_1d0._0_8_,(ulong)(auStack_1c0._0_8_ + 1));
    }
  }
  else {
    psVar9 = DescriptorPool::Tables::AllocateString(this->tables_,(proto->package_).ptr_);
    *(string **)(local_228 + 8) = psVar9;
  }
  *(DescriptorPool **)(local_228 + 0x10) = this->pool_;
  bVar5 = DescriptorPool::Tables::AddFile(this->tables_,local_228);
  if (bVar5) {
    if ((*(string **)(local_228 + 8))->_M_string_length != 0) {
      AddPackage(this,*(string **)(local_228 + 8),&proto->super_Message,local_228);
    }
    local_108._24_8_ = local_108 + 8;
    local_108._8_4_ = _S_red;
    local_108._16_8_ = (_Base_ptr)0x0;
    local_108._40_8_ = 0;
    iVar6 = (proto->dependency_).super_RepeatedPtrFieldBase.current_size_;
    *(int *)(local_228 + 0x18) = iVar6;
    local_108._32_8_ = local_108._24_8_;
    pvVar10 = DescriptorPool::Tables::AllocateBytes(this->tables_,iVar6 << 3);
    *(void **)(local_228 + 0x20) = pvVar10;
    if (this->pool_->lazily_build_dependencies_ == true) {
      pGVar11 = DescriptorPool::Tables::AllocateOnceDynamic(this->tables_);
      *(GoogleOnceDynamic **)(local_228 + 0x30) = pGVar11;
      pvVar10 = DescriptorPool::Tables::AllocateBytes
                          (this->tables_,
                           (proto->dependency_).super_RepeatedPtrFieldBase.current_size_ << 3);
      *(void **)(local_228 + 0x28) = pvVar10;
      memset(pvVar10,0,(long)(proto->dependency_).super_RepeatedPtrFieldBase.current_size_ << 3);
    }
    else {
      *(undefined8 *)(local_228 + 0x28) = 0;
      *(undefined8 *)(local_228 + 0x30) = 0;
    }
    local_1f8 = (pointer)&this->unused_dependency_;
    std::
    _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
    ::clear((_Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
             *)local_1f8);
    local_138._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_138._M_impl.super__Rb_tree_header._M_header;
    local_138._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    iVar6 = 0;
    local_138._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_138._M_impl.super__Rb_tree_header._M_node_count = 0;
    this_01 = &proto->weak_dependency_;
    local_138._M_impl.super__Rb_tree_header._M_header._M_right =
         local_138._M_impl.super__Rb_tree_header._M_header._M_left;
    if (0 < (proto->weak_dependency_).current_size_) {
      do {
        piVar12 = RepeatedField<int>::Get(this_01,iVar6);
        local_1d0._0_4_ = *piVar12;
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        _M_insert_unique<int>(&local_138,(int *)local_1d0);
        iVar6 = iVar6 + 1;
      } while (iVar6 < this_01->current_size_);
    }
    if (0 < (proto->dependency_).super_RepeatedPtrFieldBase.current_size_) {
      this_00 = &proto->dependency_;
      lVar27 = 0;
      do {
        iVar6 = (int)lVar27;
        pTVar13 = internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                            (&this_00->super_RepeatedPtrFieldBase,iVar6);
        pVar32 = std::
                 _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                 ::_M_insert_unique<std::__cxx11::string_const&>
                           ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                             *)local_108,pTVar13);
        if (((undefined1  [16])pVar32 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          AddTwiceListedError(this,proto,iVar6);
        }
        pTVar2 = this->tables_;
        pTVar13 = internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                            (&this_00->super_RepeatedPtrFieldBase,iVar6);
        local_1d0._0_8_ = (pTVar13->_M_dataplus)._M_p;
        cVar14 = std::
                 _Hashtable<const_char_*,_std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_std::__detail::_Select1st,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find((_Hashtable<const_char_*,_std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_std::__detail::_Select1st,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)&pTVar2->files_by_name_,(key_type *)local_1d0);
        if (cVar14.
            super__Node_iterator_base<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_true>
            ._M_cur == (__node_type *)0x0) {
          local_170._0_8_ = (FileDescriptor *)0x0;
        }
        else {
          local_170._0_8_ =
               *(undefined8 *)
                ((long)cVar14.
                       super__Node_iterator_base<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_true>
                       ._M_cur + 0x10);
        }
        if (((FileDescriptor *)local_170._0_8_ == (FileDescriptor *)0x0) &&
           (pDVar20 = this->pool_->underlay_, pDVar20 != (DescriptorPool *)0x0)) {
          pTVar13 = internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                              (&this_00->super_RepeatedPtrFieldBase,iVar6);
          local_170._0_8_ = DescriptorPool::FindFileByName(pDVar20,pTVar13);
        }
        uVar4 = local_170._0_8_;
        if ((FileDescriptor *)local_170._0_8_ == local_228) {
          DescriptorPool::Tables::RollbackToLastCheckpoint(this->tables_);
        }
        else {
          pDVar20 = this->pool_;
          if ((FileDescriptor *)local_170._0_8_ == (FileDescriptor *)0x0) {
            if (pDVar20->allow_unknown_ == false) {
              if (pDVar20->enforce_weak_ == false) {
                p_Var16 = &local_138._M_impl.super__Rb_tree_header._M_header;
                for (p_Var22 = local_138._M_impl.super__Rb_tree_header._M_header._M_parent;
                    (_Rb_tree_header *)p_Var22 != (_Rb_tree_header *)0x0;
                    p_Var22 = (&p_Var22->_M_left)[(int)*(size_t *)(p_Var22 + 1) < lVar27]) {
                  if (lVar27 <= (int)*(size_t *)(p_Var22 + 1)) {
                    p_Var16 = p_Var22;
                  }
                }
                p_Var1 = &local_138._M_impl.super__Rb_tree_header;
                p_Var23 = p_Var1;
                if (((_Rb_tree_header *)p_Var16 != p_Var1) &&
                   (p_Var23 = (_Rb_tree_header *)p_Var16,
                   lVar27 < (int)((_Rb_tree_header *)p_Var16)->_M_node_count)) {
                  p_Var23 = p_Var1;
                }
                if (p_Var23 != p_Var1) goto LAB_002e3862;
              }
              if (pDVar20->lazily_build_dependencies_ == false) {
                AddImportError(this,proto,iVar6);
              }
            }
            else {
LAB_002e3862:
              pTVar13 = internal::RepeatedPtrFieldBase::
                        Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                                  (&this_00->super_RepeatedPtrFieldBase,iVar6);
              local_170._0_8_ = DescriptorPool::NewPlaceholderFileWithMutexHeld(pDVar20,pTVar13);
            }
          }
          else if (((pDVar20->enforce_dependencies_ == true) &&
                   (cVar15 = std::
                             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::find(&(pDVar20->unused_import_track_files_)._M_t,(proto->name_).ptr_)
                   , (_Rb_tree_header *)cVar15._M_node !=
                     &(this->pool_->unused_import_track_files_)._M_t._M_impl.super__Rb_tree_header))
                  && (*(int *)(local_170._0_8_ + 0x38) == 0)) {
            std::
            _Rb_tree<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::_Identity<google::protobuf::FileDescriptor_const*>,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>
            ::_M_insert_unique<google::protobuf::FileDescriptor_const*const&>
                      ((_Rb_tree<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::_Identity<google::protobuf::FileDescriptor_const*>,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>
                        *)local_1f8,(FileDescriptor **)&local_170);
          }
          *(undefined8 *)(*(long *)(local_228 + 0x20) + lVar27 * 8) = local_170._0_8_;
          if ((this->pool_->lazily_build_dependencies_ == true) &&
             ((FileDescriptor *)local_170._0_8_ == (FileDescriptor *)0x0)) {
            pTVar2 = this->tables_;
            pTVar13 = internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                                (&this_00->super_RepeatedPtrFieldBase,iVar6);
            psVar9 = DescriptorPool::Tables::AllocateString(pTVar2,pTVar13);
            *(string **)(*(long *)(local_228 + 0x28) + lVar27 * 8) = psVar9;
          }
        }
        if ((FileDescriptor *)uVar4 == local_228) goto LAB_002e433d;
        lVar27 = lVar27 + 1;
      } while (lVar27 < (proto->dependency_).super_RepeatedPtrFieldBase.current_size_);
    }
    pvVar10 = DescriptorPool::Tables::AllocateBytes
                        (this->tables_,(proto->public_dependency_).current_size_ << 2);
    this_02 = &proto->public_dependency_;
    *(void **)(local_228 + 0x40) = pvVar10;
    if (this_02->current_size_ < 1) {
      iVar6 = 0;
    }
    else {
      iVar26 = 0;
      iVar6 = 0;
      do {
        piVar12 = RepeatedField<int>::Get(this_02,iVar26);
        iVar7 = *piVar12;
        if (((long)iVar7 < 0) ||
           ((proto->dependency_).super_RepeatedPtrFieldBase.current_size_ <= iVar7)) {
          AddError(this,(proto->name_).ptr_,&proto->super_Message,OTHER,
                   "Invalid public dependency index.");
        }
        else {
          lVar27 = (long)iVar6;
          iVar6 = iVar6 + 1;
          *(int *)(*(long *)(local_228 + 0x40) + lVar27 * 4) = iVar7;
          if (this->pool_->lazily_build_dependencies_ == false) {
            if (*(GoogleOnceDynamic **)(local_228 + 0x30) != (GoogleOnceDynamic *)0x0) {
              GoogleOnceDynamic::Init<google::protobuf::FileDescriptor_const>
                        (*(GoogleOnceDynamic **)(local_228 + 0x30),
                         FileDescriptor::DependenciesOnceInit,local_228);
            }
            local_1d0._0_8_ = *(undefined8 *)(*(long *)(local_228 + 0x20) + (long)iVar7 * 8);
            pVar33 = std::
                     _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                     ::equal_range((_Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                                    *)local_1f8,(key_type *)local_1d0);
            std::
            _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
            ::_M_erase_aux((_Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                            *)local_1f8,(_Base_ptr)pVar33.first._M_node,
                           (_Base_ptr)pVar33.second._M_node);
          }
        }
        iVar26 = iVar26 + 1;
      } while (iVar26 < this_02->current_size_);
    }
    *(int *)(local_228 + 0x38) = iVar6;
    std::
    _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
    ::clear(&(this->dependencies_)._M_t);
    if ((this->pool_->lazily_build_dependencies_ == false) && (0 < *(int *)(local_228 + 0x18))) {
      lVar27 = 0;
      do {
        if (*(GoogleOnceDynamic **)(local_228 + 0x30) != (GoogleOnceDynamic *)0x0) {
          GoogleOnceDynamic::Init<google::protobuf::FileDescriptor_const>
                    (*(GoogleOnceDynamic **)(local_228 + 0x30),FileDescriptor::DependenciesOnceInit,
                     local_228);
        }
        RecordPublicDependencies
                  (this,*(FileDescriptor **)(*(long *)(local_228 + 0x20) + lVar27 * 8));
        lVar27 = lVar27 + 1;
      } while (lVar27 < *(int *)(local_228 + 0x18));
    }
    pvVar10 = DescriptorPool::Tables::AllocateBytes(this->tables_,this_01->current_size_ << 2);
    *(void **)(local_228 + 0x50) = pvVar10;
    if (this_01->current_size_ < 1) {
      iVar6 = 0;
    }
    else {
      iVar26 = 0;
      iVar6 = 0;
      do {
        piVar12 = RepeatedField<int>::Get(this_01,iVar26);
        iVar7 = *piVar12;
        if ((iVar7 < 0) || ((proto->dependency_).super_RepeatedPtrFieldBase.current_size_ <= iVar7))
        {
          AddError(this,(proto->name_).ptr_,&proto->super_Message,OTHER,
                   "Invalid weak dependency index.");
        }
        else {
          lVar27 = (long)iVar6;
          iVar6 = iVar6 + 1;
          *(int *)(*(long *)(local_228 + 0x50) + lVar27 * 4) = iVar7;
        }
        iVar26 = iVar26 + 1;
      } while (iVar26 < this_01->current_size_);
    }
    *(int *)(local_228 + 0x48) = iVar6;
    iVar6 = (proto->message_type_).super_RepeatedPtrFieldBase.current_size_;
    *(int *)(local_228 + 0x58) = iVar6;
    pvVar10 = DescriptorPool::Tables::AllocateBytes(this->tables_,iVar6 * 0xa8);
    *(void **)(local_228 + 0x60) = pvVar10;
    if (0 < (proto->message_type_).super_RepeatedPtrFieldBase.current_size_) {
      lVar27 = 0;
      lVar28 = 0;
      do {
        pTVar17 = internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                            (&(proto->message_type_).super_RepeatedPtrFieldBase,(int)lVar28);
        BuildMessage(this,pTVar17,(Descriptor *)0x0,
                     (Descriptor *)(*(long *)(local_228 + 0x60) + lVar27));
        lVar28 = lVar28 + 1;
        lVar27 = lVar27 + 0xa8;
      } while (lVar28 < (proto->message_type_).super_RepeatedPtrFieldBase.current_size_);
    }
    iVar6 = (proto->enum_type_).super_RepeatedPtrFieldBase.current_size_;
    *(int *)(local_228 + 0x68) = iVar6;
    pvVar10 = DescriptorPool::Tables::AllocateBytes(this->tables_,iVar6 * 0x38);
    *(void **)(local_228 + 0x70) = pvVar10;
    if (0 < (proto->enum_type_).super_RepeatedPtrFieldBase.current_size_) {
      lVar27 = 0;
      lVar28 = 0;
      do {
        proto_00 = internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>::TypeHandler>
                             (&(proto->enum_type_).super_RepeatedPtrFieldBase,(int)lVar28);
        BuildEnum(this,proto_00,(Descriptor *)0x0,
                  (EnumDescriptor *)(*(long *)(local_228 + 0x70) + lVar27));
        lVar28 = lVar28 + 1;
        lVar27 = lVar27 + 0x38;
      } while (lVar28 < (proto->enum_type_).super_RepeatedPtrFieldBase.current_size_);
    }
    iVar6 = (proto->service_).super_RepeatedPtrFieldBase.current_size_;
    *(int *)(local_228 + 0x78) = iVar6;
    pvVar10 = DescriptorPool::Tables::AllocateBytes(this->tables_,iVar6 * 0x30);
    *(void **)(local_228 + 0x80) = pvVar10;
    if (0 < (proto->service_).super_RepeatedPtrFieldBase.current_size_) {
      lVar27 = 0;
      lVar28 = 0;
      do {
        proto_01 = internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<google::protobuf::ServiceDescriptorProto>::TypeHandler>
                             (&(proto->service_).super_RepeatedPtrFieldBase,(int)lVar28);
        BuildService(this,proto_01,extraout_RDX,
                     (ServiceDescriptor *)(*(long *)(local_228 + 0x80) + lVar27));
        lVar28 = lVar28 + 1;
        lVar27 = lVar27 + 0x30;
      } while (lVar28 < (proto->service_).super_RepeatedPtrFieldBase.current_size_);
    }
    iVar6 = (proto->extension_).super_RepeatedPtrFieldBase.current_size_;
    *(int *)(local_228 + 0x88) = iVar6;
    pvVar10 = DescriptorPool::Tables::AllocateBytes(this->tables_,iVar6 * 0xa8);
    *(void **)(local_228 + 0x98) = pvVar10;
    if (0 < (proto->extension_).super_RepeatedPtrFieldBase.current_size_) {
      lVar27 = 0;
      lVar28 = 0;
      do {
        proto_02 = internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                             (&(proto->extension_).super_RepeatedPtrFieldBase,(int)lVar28);
        BuildFieldOrExtension
                  (this,proto_02,(Descriptor *)0x0,
                   (FieldDescriptor *)(*(long *)(local_228 + 0x98) + lVar27),true);
        lVar28 = lVar28 + 1;
        lVar27 = lVar27 + 0xa8;
      } while (lVar28 < (proto->extension_).super_RepeatedPtrFieldBase.current_size_);
    }
    if (((proto->_has_bits_).has_bits_[0] & 8) == 0) {
      *(undefined8 *)(local_228 + 0xa0) = 0;
    }
    else {
      orig_options = proto->options_;
      if (orig_options == (FileOptions *)0x0) {
        orig_options = (FileOptions *)&_FileOptions_default_instance_;
      }
      AllocateOptions(this,orig_options,local_228);
    }
    CrossLinkFile(this,local_228,proto);
    result = extraout_RDX_00;
    if (this->had_errors_ == false) {
      OptionInterpreter::OptionInterpreter((OptionInterpreter *)local_1d0,this);
      pOVar29 = (this->options_to_interpret_).
                super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pOVar25 = (this->options_to_interpret_).
                super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (pOVar29 != pOVar25) {
        do {
          paVar30 = &local_218.field_2;
          descriptor = pOVar29->original_options;
          this_03 = *(MessageLite **)&pOVar29->options;
          local_1f8 = pOVar29;
          local_1d0._8_8_ = pOVar29;
          iVar6 = (*this_03->_vptr_MessageLite[0x17])(this_03);
          local_1f0._M_dataplus._M_p = (pointer)0x14;
          local_218._M_dataplus._M_p = (pointer)paVar30;
          local_218._M_dataplus._M_p =
               (pointer)std::__cxx11::string::_M_create((ulong *)&local_218,(ulong)&local_1f0);
          local_218.field_2._M_allocated_capacity = (size_type)local_1f0._M_dataplus._M_p;
          builtin_strncpy(local_218._M_dataplus._M_p,"uninterpreted_option",0x14);
          local_218._M_string_length = (size_type)local_1f0._M_dataplus._M_p;
          local_218._M_dataplus._M_p[(long)local_1f0._M_dataplus._M_p] = '\0';
          pFVar18 = Descriptor::FindFieldByName
                              ((Descriptor *)CONCAT44(extraout_var,iVar6),&local_218);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218._M_dataplus._M_p != paVar30) {
            operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
          }
          if (pFVar18 == (FieldDescriptor *)0x0) {
            internal::LogMessage::LogMessage
                      (&local_170,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
                       ,0x1740);
            pLVar19 = internal::LogMessage::operator<<
                                (&local_170,"CHECK failed: uninterpreted_options_field != NULL: ");
            pLVar19 = internal::LogMessage::operator<<
                                (pLVar19,
                                 "No field named \"uninterpreted_option\" in the Options proto.");
            internal::LogFinisher::operator=((LogFinisher *)&local_218,pLVar19);
            internal::LogMessage::~LogMessage(&local_170);
          }
          iVar6 = (*this_03->_vptr_MessageLite[0x16])(this_03);
          (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar6) + 0x38))
                    ((long *)CONCAT44(extraout_var_00,iVar6),this_03,pFVar18);
          iVar6 = (*(descriptor->super_MessageLite)._vptr_MessageLite[0x17])(descriptor);
          local_1f0._M_dataplus._M_p = (pointer)0x14;
          local_218._M_dataplus._M_p = (pointer)paVar30;
          local_218._M_dataplus._M_p =
               (pointer)std::__cxx11::string::_M_create((ulong *)&local_218,(ulong)&local_1f0);
          local_218.field_2._M_allocated_capacity = (size_type)local_1f0._M_dataplus._M_p;
          *(undefined8 *)local_218._M_dataplus._M_p = 0x707265746e696e75;
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_218._M_dataplus._M_p + 8) = 'r';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_218._M_dataplus._M_p + 9) = 'e';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_218._M_dataplus._M_p + 10) = 't';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_218._M_dataplus._M_p + 0xb) = 'e';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_218._M_dataplus._M_p + 0xc) = 'd';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_218._M_dataplus._M_p + 0xd) = '_';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_218._M_dataplus._M_p + 0xe) = 'o';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_218._M_dataplus._M_p + 0xf) = 'p';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_218._M_dataplus._M_p + 0x10) = 't';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_218._M_dataplus._M_p + 0x11) = 'i';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_218._M_dataplus._M_p + 0x12) = 'o';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_218._M_dataplus._M_p + 0x13) = 'n';
          local_218._M_string_length = (size_type)local_1f0._M_dataplus._M_p;
          local_218._M_dataplus._M_p[(long)local_1f0._M_dataplus._M_p] = '\0';
          pFVar18 = Descriptor::FindFieldByName
                              ((Descriptor *)CONCAT44(extraout_var_01,iVar6),&local_218);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218._M_dataplus._M_p != paVar30) {
            operator_delete(local_218._M_dataplus._M_p,
                            (ulong)(local_218.field_2._M_allocated_capacity + 1));
          }
          if (pFVar18 == (FieldDescriptor *)0x0) {
            internal::LogMessage::LogMessage
                      (&local_d8,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
                       ,0x1748);
            pLVar19 = internal::LogMessage::operator<<
                                (&local_d8,
                                 "CHECK failed: original_uninterpreted_options_field != NULL: ");
            pLVar19 = internal::LogMessage::operator<<
                                (pLVar19,
                                 "No field named \"uninterpreted_option\" in the Options proto.");
            internal::LogFinisher::operator=((LogFinisher *)&local_218,pLVar19);
            internal::LogMessage::~LogMessage(&local_d8);
          }
          iVar6 = (*(descriptor->super_MessageLite)._vptr_MessageLite[0x16])(descriptor);
          iVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar6) + 0x30))
                            ((long *)CONCAT44(extraout_var_02,iVar6),descriptor,pFVar18);
          if (0 < iVar6) {
            iVar26 = 0;
            do {
              iVar7 = (*(descriptor->super_MessageLite)._vptr_MessageLite[0x16])(descriptor);
              pDVar20 = (DescriptorPool *)
                        (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar7) + 0x1a0))
                                  ((long *)CONCAT44(extraout_var_03,iVar7),descriptor,pFVar18,iVar26
                                  );
              lVar27 = __dynamic_cast(pDVar20,&Message::typeinfo,&UninterpretedOption::typeinfo,0);
              if (lVar27 == 0) {
                __assert_fail("f == NULL || dynamic_cast<To>(f) != NULL",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/stubs/casts.h"
                              ,0x5b,
                              "To google::protobuf::internal::down_cast(From *) [To = const google::protobuf::UninterpretedOption *, From = const google::protobuf::Message]"
                             );
              }
              auStack_1c0._0_8_ = pDVar20;
              bVar5 = OptionInterpreter::InterpretSingleOption
                                ((OptionInterpreter *)local_1d0,(Message *)this_03);
              if (!bVar5) {
                local_1d0._8_8_ = (OptionsToInterpret *)0x0;
                auStack_1c0._0_8_ = (DescriptorPool *)0x0;
                pOVar29 = local_1f8;
                goto LAB_002e421f;
              }
              iVar26 = iVar26 + 1;
            } while (iVar6 != iVar26);
          }
          local_1d0._8_8_ = (OptionsToInterpret *)0x0;
          auStack_1c0._0_8_ = (DescriptorPool *)0x0;
          local_218._M_string_length = 0;
          local_218.field_2._M_allocated_capacity =
               local_218.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
          bVar5 = MessageLite::AppendPartialToString(this_03,&local_218);
          pOVar29 = local_1f8;
          if (!bVar5) {
            internal::LogMessage::LogMessage
                      (&local_68,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
                       ,0x1765);
            pLVar19 = internal::LogMessage::operator<<
                                (&local_68,"CHECK failed: options->AppendPartialToString(&buf): ");
            pLVar19 = internal::LogMessage::operator<<
                                (pLVar19,"Protocol message could not be serialized.");
            internal::LogFinisher::operator=((LogFinisher *)&local_1f0,pLVar19);
            if (!bVar5) {
              internal::LogMessage::~LogMessage(&local_68);
            }
          }
          bVar5 = MessageLite::ParsePartialFromString(this_03,&local_218);
          if (!bVar5) {
            internal::LogMessage::LogMessage
                      (&local_a0,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
                       ,0x1767);
            pLVar19 = internal::LogMessage::operator<<
                                (&local_a0,"CHECK failed: options->ParsePartialFromString(buf): ");
            pLVar19 = internal::LogMessage::operator<<
                                (pLVar19,"Protocol message serialized itself in invalid fashion.");
            internal::LogFinisher::operator=((LogFinisher *)&local_1f0,pLVar19);
            if (!bVar5) {
              internal::LogMessage::~LogMessage(&local_a0);
            }
          }
          iVar6 = (*this_03->_vptr_MessageLite[8])(this_03);
          uVar4 = local_1d0._0_8_;
          if ((char)iVar6 == '\0') {
            (*this_03->_vptr_MessageLite[9])(local_190);
            plVar21 = (long *)std::__cxx11::string::replace((ulong)local_190,0,(char *)0x0,0x3ad256)
            ;
            psVar24 = (size_type *)(plVar21 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar21 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar24) {
              local_1f0.field_2._M_allocated_capacity = *psVar24;
              local_1f0.field_2._8_8_ = plVar21[3];
              local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
            }
            else {
              local_1f0.field_2._M_allocated_capacity = *psVar24;
              local_1f0._M_dataplus._M_p = (pointer)*plVar21;
            }
            local_1f0._M_string_length = plVar21[1];
            *plVar21 = (long)psVar24;
            plVar21[1] = 0;
            *(undefined1 *)(plVar21 + 2) = 0;
            AddWarning((DescriptorBuilder *)uVar4,&pOVar29->element_name,descriptor,OTHER,&local_1f0
                      );
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
              operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_190[0] != local_180) {
              operator_delete(local_190[0],local_180[0] + 1);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218._M_dataplus._M_p != &local_218.field_2) {
            operator_delete(local_218._M_dataplus._M_p,
                            (ulong)(local_218.field_2._M_allocated_capacity + 1));
          }
LAB_002e421f:
          pOVar29 = pOVar29 + 1;
          pOVar25 = (this->options_to_interpret_).
                    super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        } while (pOVar29 != pOVar25);
      }
      pOVar29 = (this->options_to_interpret_).
                super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (pOVar25 != pOVar29) {
        paVar30 = &(pOVar29->element_name).field_2;
        do {
          plVar21 = (long *)(((string *)(paVar30 + -1))->_M_dataplus)._M_p;
          if (paVar30 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)plVar21) {
            operator_delete(plVar21,paVar30->_M_allocated_capacity + 1);
          }
          if (paVar30 + -2 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)paVar30[-3]._M_allocated_capacity) {
            operator_delete((long *)paVar30[-3]._M_allocated_capacity,
                            paVar30[-2]._M_allocated_capacity + 1);
          }
          pOVar31 = (pointer)(paVar30 + 2);
          paVar30 = paVar30 + 5;
        } while (pOVar31 != pOVar25);
        (this->options_to_interpret_).
        super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
        ._M_impl.super__Vector_impl_data._M_finish = pOVar29;
      }
      OptionInterpreter::~OptionInterpreter((OptionInterpreter *)local_1d0);
      result = extraout_RDX_01;
    }
    if ((this->had_errors_ == false) && (this->pool_->lazily_build_dependencies_ == false)) {
      ValidateFileOptions(this,local_228,proto);
      result = extraout_RDX_02;
    }
    if ((this->had_errors_ == true) &&
       (0 < (proto->message_type_).super_RepeatedPtrFieldBase.current_size_)) {
      lVar27 = 0;
      lVar28 = 0;
      do {
        lVar3 = *(long *)(local_228 + 0x60);
        pTVar17 = internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                            (&(proto->message_type_).super_RepeatedPtrFieldBase,(int)lVar28);
        DetectMapConflicts(this,(Descriptor *)(lVar3 + lVar27),pTVar17);
        lVar28 = lVar28 + 1;
        lVar27 = lVar27 + 0xa8;
        result = extraout_RDX_03;
      } while (lVar28 < (proto->message_type_).super_RepeatedPtrFieldBase.current_size_);
    }
    if (((this->unused_dependency_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) &&
       (this->pool_->lazily_build_dependencies_ == false)) {
      LogUnusedDependency(this,proto,result);
    }
    if (this->had_errors_ == true) {
      DescriptorPool::Tables::RollbackToLastCheckpoint(this->tables_);
LAB_002e433d:
      local_228 = (FileDescriptor *)0x0;
    }
    else {
      DescriptorPool::Tables::ClearLastCheckpoint(this->tables_);
      local_228[0xb8] = (FileDescriptor)0x1;
    }
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              (&local_138);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_108);
  }
  else {
    AddError(this,(proto->name_).ptr_,&proto->super_Message,OTHER,
             "A file with this name is already in the pool.");
    DescriptorPool::Tables::RollbackToLastCheckpoint(this->tables_);
    local_228 = (FileDescriptor *)0x0;
  }
  return local_228;
}

Assistant:

const FileDescriptor* DescriptorBuilder::BuildFileImpl(
    const FileDescriptorProto& proto) {
  // Checkpoint the tables so that we can roll back if something goes wrong.
  tables_->AddCheckpoint();

  FileDescriptor* result = tables_->Allocate<FileDescriptor>();
  file_ = result;

  result->is_placeholder_ = false;
  result->finished_building_ = false;
  if (proto.has_source_code_info()) {
    SourceCodeInfo *info = tables_->AllocateMessage<SourceCodeInfo>();
    info->CopyFrom(proto.source_code_info());
    result->source_code_info_ = info;
  } else {
    result->source_code_info_ = &SourceCodeInfo::default_instance();
  }

  file_tables_ = tables_->AllocateFileTables();
  file_->tables_ = file_tables_;

  if (!proto.has_name()) {
    AddError("", proto, DescriptorPool::ErrorCollector::OTHER,
             "Missing field: FileDescriptorProto.name.");
  }

  // TODO(liujisi): Report error when the syntax is empty after all the protos
  // have added the syntax statement.
  if (proto.syntax().empty() || proto.syntax() == "proto2") {
    file_->syntax_ = FileDescriptor::SYNTAX_PROTO2;
  } else if (proto.syntax() == "proto3") {
    file_->syntax_ = FileDescriptor::SYNTAX_PROTO3;
  } else {
    file_->syntax_ = FileDescriptor::SYNTAX_UNKNOWN;
    AddError(proto.name(), proto, DescriptorPool::ErrorCollector::OTHER,
             "Unrecognized syntax: " + proto.syntax());
  }

  result->name_ = tables_->AllocateString(proto.name());
  if (proto.has_package()) {
    result->package_ = tables_->AllocateString(proto.package());
  } else {
    // We cannot rely on proto.package() returning a valid string if
    // proto.has_package() is false, because we might be running at static
    // initialization time, in which case default values have not yet been
    // initialized.
    result->package_ = tables_->AllocateString("");
  }
  result->pool_ = pool_;

  // Add to tables.
  if (!tables_->AddFile(result)) {
    AddError(proto.name(), proto, DescriptorPool::ErrorCollector::OTHER,
             "A file with this name is already in the pool.");
    // Bail out early so that if this is actually the exact same file, we
    // don't end up reporting that every single symbol is already defined.
    tables_->RollbackToLastCheckpoint();
    return NULL;
  }
  if (!result->package().empty()) {
    AddPackage(result->package(), proto, result);
  }

  // Make sure all dependencies are loaded.
  std::set<string> seen_dependencies;
  result->dependency_count_ = proto.dependency_size();
  result->dependencies_ =
      tables_->AllocateArray<const FileDescriptor*>(proto.dependency_size());
  if (pool_->lazily_build_dependencies_) {
    result->dependencies_once_ = tables_->AllocateOnceDynamic();
    result->dependencies_names_ =
        tables_->AllocateArray<const string*>(proto.dependency_size());
    memset(result->dependencies_names_, 0,
           sizeof(*result->dependencies_names_) * proto.dependency_size());
  } else {
    result->dependencies_once_ = NULL;
    result->dependencies_names_ = NULL;
  }
  unused_dependency_.clear();
  std::set<int> weak_deps;
  for (int i = 0; i < proto.weak_dependency_size(); ++i) {
    weak_deps.insert(proto.weak_dependency(i));
  }
  for (int i = 0; i < proto.dependency_size(); i++) {
    if (!seen_dependencies.insert(proto.dependency(i)).second) {
      AddTwiceListedError(proto, i);
    }

    const FileDescriptor* dependency = tables_->FindFile(proto.dependency(i));
    if (dependency == NULL && pool_->underlay_ != NULL) {
      dependency = pool_->underlay_->FindFileByName(proto.dependency(i));
    }

    if (dependency == result) {
      // Recursive import.  dependency/result is not fully initialized, and it's
      // dangerous to try to do anything with it.  The recursive import error
      // will be detected and reported in DescriptorBuilder::BuildFile().
      tables_->RollbackToLastCheckpoint();
      return NULL;
    }

    if (dependency == NULL) {
      if (pool_->allow_unknown_ ||
          (!pool_->enforce_weak_ && weak_deps.find(i) != weak_deps.end())) {
        dependency =
            pool_->NewPlaceholderFileWithMutexHeld(proto.dependency(i));
      } else {
        if (!pool_->lazily_build_dependencies_) {
          AddImportError(proto, i);
        }
      }
    } else {
      // Add to unused_dependency_ to track unused imported files.
      // Note: do not track unused imported files for public import.
      if (pool_->enforce_dependencies_ &&
          (pool_->unused_import_track_files_.find(proto.name()) !=
           pool_->unused_import_track_files_.end()) &&
          (dependency->public_dependency_count() == 0)) {
        unused_dependency_.insert(dependency);
      }
    }

    result->dependencies_[i] = dependency;
    if (pool_->lazily_build_dependencies_ && !dependency) {
      result->dependencies_names_[i] =
          tables_->AllocateString(proto.dependency(i));
    }
  }

  // Check public dependencies.
  int public_dependency_count = 0;
  result->public_dependencies_ = tables_->AllocateArray<int>(
      proto.public_dependency_size());
  for (int i = 0; i < proto.public_dependency_size(); i++) {
    // Only put valid public dependency indexes.
    int index = proto.public_dependency(i);
    if (index >= 0 && index < proto.dependency_size()) {
      result->public_dependencies_[public_dependency_count++] = index;
      // Do not track unused imported files for public import.
      // Calling dependency(i) builds that file when doing lazy imports,
      // need to avoid doing this. Unused dependency detection isn't done
      // when building lazily, anyways.
      if (!pool_->lazily_build_dependencies_) {
        unused_dependency_.erase(result->dependency(index));
      }
    } else {
      AddError(proto.name(), proto,
               DescriptorPool::ErrorCollector::OTHER,
               "Invalid public dependency index.");
    }
  }
  result->public_dependency_count_ = public_dependency_count;

  // Build dependency set
  dependencies_.clear();
  // We don't/can't do proper dependency error checking when
  // lazily_build_dependencies_, and calling dependency(i) will force
  // a dependency to be built, which we don't want.
  if (!pool_->lazily_build_dependencies_) {
    for (int i = 0; i < result->dependency_count(); i++) {
      RecordPublicDependencies(result->dependency(i));
    }
  }

  // Check weak dependencies.
  int weak_dependency_count = 0;
  result->weak_dependencies_ = tables_->AllocateArray<int>(
      proto.weak_dependency_size());
  for (int i = 0; i < proto.weak_dependency_size(); i++) {
    int index = proto.weak_dependency(i);
    if (index >= 0 && index < proto.dependency_size()) {
      result->weak_dependencies_[weak_dependency_count++] = index;
    } else {
      AddError(proto.name(), proto,
               DescriptorPool::ErrorCollector::OTHER,
               "Invalid weak dependency index.");
    }
  }
  result->weak_dependency_count_ = weak_dependency_count;

  // Convert children.
  BUILD_ARRAY(proto, result, message_type, BuildMessage  , NULL);
  BUILD_ARRAY(proto, result, enum_type   , BuildEnum     , NULL);
  BUILD_ARRAY(proto, result, service     , BuildService  , NULL);
  BUILD_ARRAY(proto, result, extension   , BuildExtension, NULL);

  // Copy options.
  if (!proto.has_options()) {
    result->options_ = NULL;  // Will set to default_instance later.
  } else {
    AllocateOptions(proto.options(), result);
  }

  // Note that the following steps must occur in exactly the specified order.

  // Cross-link.
  CrossLinkFile(result, proto);

  // Interpret any remaining uninterpreted options gathered into
  // options_to_interpret_ during descriptor building.  Cross-linking has made
  // extension options known, so all interpretations should now succeed.
  if (!had_errors_) {
    OptionInterpreter option_interpreter(this);
    for (std::vector<OptionsToInterpret>::iterator iter =
             options_to_interpret_.begin();
         iter != options_to_interpret_.end(); ++iter) {
      option_interpreter.InterpretOptions(&(*iter));
    }
    options_to_interpret_.clear();
  }

  // Validate options. See comments at InternalSetLazilyBuildDependencies about
  // error checking and lazy import building.
  if (!had_errors_ && !pool_->lazily_build_dependencies_) {
    ValidateFileOptions(result, proto);
  }

  // Additional naming conflict check for map entry types. Only need to check
  // this if there are already errors.
  if (had_errors_) {
    for (int i = 0; i < proto.message_type_size(); ++i) {
      DetectMapConflicts(result->message_type(i), proto.message_type(i));
    }
  }


  // Again, see comments at InternalSetLazilyBuildDependencies about error
  // checking.
  if (!unused_dependency_.empty() && !pool_->lazily_build_dependencies_) {
    LogUnusedDependency(proto, result);
  }

  if (had_errors_) {
    tables_->RollbackToLastCheckpoint();
    return NULL;
  } else {
    tables_->ClearLastCheckpoint();
    result->finished_building_ = true;
    return result;
  }
}